

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synthesis.c
# Opt level: O3

int vorbis_synthesis_halfrate(vorbis_info *vi,int flag)

{
  if ((flag != 0) && (*vi->codec_setup < 0x41)) {
    return -1;
  }
  *(uint *)((long)vi->codec_setup + 0x1690) = (uint)(flag != 0);
  return 0;
}

Assistant:

int vorbis_synthesis_halfrate(vorbis_info *vi,int flag){
  /* set / clear half-sample-rate mode */
  codec_setup_info     *ci=vi->codec_setup;

  /* right now, our MDCT can't handle < 64 sample windows. */
  if(ci->blocksizes[0]<=64 && flag)return -1;
  ci->halfrate_flag=(flag?1:0);
  return 0;
}